

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O0

char * __thiscall Imf_3_2::anon_unknown_0::PtrIStream::readMemoryMapped(PtrIStream *this,int n)

{
  char *pcVar1;
  ostream *poVar2;
  InputExc *this_00;
  int in_ESI;
  long in_RDI;
  char *value;
  stringstream _iex_throw_s;
  stringstream local_198 [16];
  ostream local_188 [380];
  int local_c;
  
  if (*(ulong *)(in_RDI + 0x38) < (ulong)(*(long *)(in_RDI + 0x30) + (long)in_ESI)) {
    local_c = in_ESI;
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_198);
    poVar2 = std::operator<<(local_188,"Early end of file: requesting ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,*(long *)(in_RDI + 0x38) - (*(long *)(in_RDI + 0x30) + (long)local_c)
                       );
    std::operator<<(poVar2," extra bytes after file\n");
    this_00 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::InputExc::InputExc(this_00,local_198);
    __cxa_throw(this_00,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
  }
  pcVar1 = *(char **)(in_RDI + 0x30);
  *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + (long)in_ESI;
  return pcVar1;
}

Assistant:

virtual char* readMemoryMapped (int n)
    {

        if (n + current > end)
        {
            THROW (
                IEX_NAMESPACE::InputExc,
                "Early end of file: requesting "
                    << end - (n + current) << " extra bytes after file\n");
        }
        const char* value = current;
        current += n;

        return const_cast<char*> (value);
    }